

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath_test.cpp
# Opt level: O0

void __thiscall
SphericalTriangleArea_Basics_Test::SphericalTriangleArea_Basics_Test
          (SphericalTriangleArea_Basics_Test *this)

{
  undefined8 *in_RDI;
  Test *unaff_retaddr;
  
  testing::Test::Test(unaff_retaddr);
  *in_RDI = &PTR__SphericalTriangleArea_Basics_Test_03747c90;
  return;
}

Assistant:

TEST(SphericalTriangleArea, Basics) {
    {
        Float a = SphericalTriangleArea(Vector3f(1, 0, 0), Vector3f(0, 1, 0),
                                        Vector3f(0, 0, 1));
        EXPECT_TRUE(a >= .9999 * Pi / 2 && a <= 1.00001 * Pi / 2) << a;
    }

    {
        Float a = SphericalTriangleArea(Vector3f(1, 0, 0), Normalize(Vector3f(1, 1, 0)),
                                        Vector3f(0, 0, 1));
        EXPECT_TRUE(a >= .9999 * Pi / 4 && a <= 1.00001 * Pi / 4) << a;
    }

    // Random rotations
    RNG rng;
    for (int i = 0; i < 100; ++i) {
        Vector3f axis = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
        Float theta = 2 * Pi * rng.Uniform<Float>();
        Transform t = Rotate(theta, axis);
        Vector3f va = t(Vector3f(1, 0, 0));
        Vector3f vb = t(Vector3f(0, 1, 0));
        Vector3f vc = t(Vector3f(0, 0, 1));
        Float a = SphericalTriangleArea(va, vb, vc);
        EXPECT_TRUE(a >= .9999 * Pi / 2 && a <= 1.0001 * Pi / 2) << a;
    }

    for (int i = 0; i < 100; ++i) {
        Vector3f axis = SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
        Float theta = 2 * Pi * rng.Uniform<Float>();
        Transform t = Rotate(theta, axis);
        Vector3f va = t(Vector3f(1, 0, 0));
        Vector3f vb = t(Normalize(Vector3f(1, 1, 0)));
        Vector3f vc = t(Vector3f(0, 0, 1));
        Float a = SphericalTriangleArea(va, vb, vc);
        EXPECT_TRUE(a >= .9999 * Pi / 4 && a <= 1.0001 * Pi / 4) << a;
    }
}